

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecurityDirWrapper.cpp
# Opt level: O0

void * __thiscall
SecurityDirWrapper::getFieldPtr(SecurityDirWrapper *this,size_t fId,size_t subField)

{
  int iVar1;
  undefined4 extraout_var;
  WIN_CERTIFICATE *cert;
  size_t subField_local;
  size_t fId_local;
  SecurityDirWrapper *this_local;
  
  this_local = (SecurityDirWrapper *)getCert(this);
  if ((WIN_CERTIFICATE *)this_local == (WIN_CERTIFICATE *)0x0) {
    this_local = (SecurityDirWrapper *)0x0;
  }
  else {
    switch(fId) {
    case 0:
      break;
    case 1:
      this_local = (SecurityDirWrapper *)&((WIN_CERTIFICATE *)this_local)->wRevision;
      break;
    case 2:
      this_local = (SecurityDirWrapper *)&((WIN_CERTIFICATE *)this_local)->wCertificateType;
      break;
    case 3:
      this_local = (SecurityDirWrapper *)((WIN_CERTIFICATE *)this_local)->bCertificate;
      break;
    default:
      iVar1 = (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xc])();
      this_local = (SecurityDirWrapper *)CONCAT44(extraout_var,iVar1);
    }
  }
  return this_local;
}

Assistant:

void* SecurityDirWrapper::getFieldPtr(size_t fId, size_t subField)
{
    pe::WIN_CERTIFICATE* cert = getCert();
    if (cert == NULL) return 0;

    switch (fId) {
        case CERT_LEN : return &cert->dwLength;
        case REVISION : return &cert->wRevision;
        case TYPE : return &cert->wCertificateType;
        case CERT_CONTENT : return &cert->bCertificate;
    }
    return this->getPtr();
}